

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::mouseDoubleClickEvent(QLineEdit *this,QMouseEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QLineEditPrivate *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  QPoint QVar7;
  long in_FS_OFFSET;
  QPointF local_50;
  int local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if (*(int *)(e + 0x40) != 1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
      return;
    }
    goto LAB_003ecc27;
  }
  local_50 = QSinglePointEvent::position((QSinglePointEvent *)e);
  QVar7 = QPointF::toPoint(&local_50);
  iVar5 = QLineEditPrivate::xToPos(this_00,QVar7.xp.m_i.m_i,CursorBetweenCharacters);
  bVar4 = QWidgetLineControl::composeMode((QWidgetLineControl *)this_00->control);
  if (bVar4) {
    iVar1 = this_00->control->m_cursor;
    QTextLayout::preeditAreaText();
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
    iVar2 = (int)(this_00->control->m_text).d.size;
    QWidgetLineControl::commitPreedit((QWidgetLineControl *)this_00->control);
    iVar3 = (int)(this_00->control->m_text).d.size;
    iVar6 = iVar3 - iVar2;
    if (local_40 < iVar5 - iVar1 || iVar5 - iVar1 < 0) {
      if (iVar1 < iVar5) {
        iVar5 = (iVar5 - local_40) + iVar6;
      }
      goto LAB_003ecbb9;
    }
    if (iVar3 != iVar2) {
      iVar6 = iVar6 + iVar1;
      if (iVar5 <= iVar6) {
        iVar6 = iVar5;
      }
      iVar5 = iVar6;
      if (iVar6 < iVar1) {
        iVar5 = iVar1;
      }
      goto LAB_003ecbb9;
    }
  }
  else {
LAB_003ecbb9:
    if (-1 < iVar5) {
      QWidgetLineControl::selectWordAtPos((QWidgetLineControl *)this_00->control,iVar5);
    }
  }
  iVar5 = QApplication::doubleClickInterval();
  QBasicTimer::start(&this_00->tripleClickTimer,iVar5,(QObject *)this);
  local_50 = QSinglePointEvent::position((QSinglePointEvent *)e);
  QVar7 = QPointF::toPoint(&local_50);
  this_00->tripleClick = QVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003ecc27:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::mouseDoubleClickEvent(QMouseEvent* e)
{
    Q_D(QLineEdit);

    if (e->button() == Qt::LeftButton) {
        int position = d->xToPos(e->position().toPoint().x());

        // exit composition mode
#ifndef QT_NO_IM
        if (d->control->composeMode()) {
            int preeditPos = d->control->cursor();
            int posInPreedit = position - d->control->cursor();
            int preeditLength = d->control->preeditAreaText().size();
            bool positionOnPreedit = false;

            if (posInPreedit >= 0 && posInPreedit <= preeditLength)
                positionOnPreedit = true;

            int textLength = d->control->end();
            d->control->commitPreedit();
            int sizeChange = d->control->end() - textLength;

            if (positionOnPreedit) {
                if (sizeChange == 0)
                    position = -1; // cancel selection, word disappeared
                else
                    // ensure not selecting after preedit if event happened there
                    position = qBound(preeditPos, position, preeditPos + sizeChange);
            } else if (position > preeditPos) {
                // adjust positions after former preedit by how much text changed
                position += (sizeChange - preeditLength);
            }
        }
#endif

        if (position >= 0)
            d->control->selectWordAtPos(position);

        d->tripleClickTimer.start(QApplication::doubleClickInterval(), this);
        d->tripleClick = e->position().toPoint();
    } else {
        d->sendMouseEventToInputContext(e);
    }
}